

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunay.c
# Opt level: O0

void spliceEdges(DelaunayTriangulation *delTri,Edge *a,Edge *b)

{
  Edge *pEVar1;
  Edge *tmp;
  Edge *b_local;
  Edge *a_local;
  DelaunayTriangulation *delTri_local;
  
  if (a->idx != b->idx) {
    a->onext->oprev = b;
    b->onext->oprev = a;
    pEVar1 = a->onext;
    a->onext = b->onext;
    b->onext = pEVar1;
  }
  return;
}

Assistant:

void spliceEdges(DelaunayTriangulation *delTri, Edge *a, Edge *b) {
	if (a->idx == b->idx) {
		return;
	}

	Edge *tmp;
	a->onext->oprev = b;
	b->onext->oprev = a;

	tmp = a->onext;
	a->onext = b->onext;
	b->onext = tmp;
}